

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

void __thiscall
slang::ast::ElementSelectExpression::getLongestStaticPrefixesImpl
          (ElementSelectExpression *this,
          SmallVector<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>,_2UL>
          *results,EvalContext *evalContext,Expression *longestStaticPrefix)

{
  ElementSelectExpression *in_RDI;
  EvalContext *in_stack_00000030;
  ElementSelectExpression *in_stack_00000038;
  Expression *in_stack_00000078;
  EvalContext *in_stack_00000080;
  SmallVector<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>,_2UL>
  *in_stack_00000088;
  Expression *in_stack_00000090;
  
  isConstantSelect(in_stack_00000038,in_stack_00000030);
  value(in_RDI);
  Expression::getLongestStaticPrefixes
            (in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078);
  return;
}

Assistant:

void ElementSelectExpression::getLongestStaticPrefixesImpl(
    SmallVector<std::pair<const ValueSymbol*, const Expression*>>& results,
    EvalContext& evalContext, const Expression* longestStaticPrefix) const {

    if (isConstantSelect(evalContext)) {
        if (!longestStaticPrefix)
            longestStaticPrefix = this;
    }
    else {
        longestStaticPrefix = nullptr;
    }

    value().getLongestStaticPrefixes(results, evalContext, longestStaticPrefix);
}